

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O0

char * __thiscall
MeCab::Allocator<mecab_node_t,_mecab_path_t>::alloc
          (Allocator<mecab_node_t,_mecab_path_t> *this,size_t size)

{
  ChunkFreeList<char> *pCVar1;
  char *pcVar2;
  ChunkFreeList<char> *in_RDI;
  size_t in_stack_00000010;
  ChunkFreeList<char> *in_stack_00000018;
  size_t *_size;
  scoped_ptr<MeCab::ChunkFreeList<char>_> *in_stack_ffffffffffffffe0;
  
  pCVar1 = scoped_ptr<MeCab::ChunkFreeList<char>_>::get
                     ((scoped_ptr<MeCab::ChunkFreeList<char>_> *)&in_RDI->default_size);
  if (pCVar1 == (ChunkFreeList<char> *)0x0) {
    _size = &in_RDI->default_size;
    pCVar1 = (ChunkFreeList<char> *)operator_new(0x38);
    ChunkFreeList<char>::ChunkFreeList(pCVar1,(size_t)_size);
    scoped_ptr<MeCab::ChunkFreeList<char>_>::reset(in_stack_ffffffffffffffe0,in_RDI);
  }
  scoped_ptr<MeCab::ChunkFreeList<char>_>::operator->
            ((scoped_ptr<MeCab::ChunkFreeList<char>_> *)&in_RDI->default_size);
  pcVar2 = ChunkFreeList<char>::alloc(in_stack_00000018,in_stack_00000010);
  return pcVar2;
}

Assistant:

char *alloc(size_t size) {
    if (!char_freelist_.get()) {
      char_freelist_.reset(new ChunkFreeList<char>(BUF_SIZE));
    }
    return char_freelist_->alloc(size + 1);
  }